

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

void __thiscall
mp::
TypedSolverOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Parse(TypedSolverOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,char **s,bool splitString)

{
  byte in_DL;
  undefined8 *in_RSI;
  long *in_RDI;
  exception *exc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  char *start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  BasicStringRef<char> *in_stack_ffffffffffffff00;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined1 in_stack_ffffffffffffff77;
  char **in_stack_ffffffffffffff78;
  string local_60 [32];
  string local_40 [32];
  undefined8 local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = *in_RSI;
  std::__cxx11::string::string(local_40);
  internal::
  OptionHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parse(in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
  std::__cxx11::string::operator=(local_40,local_60);
  std::__cxx11::string::~string(local_60);
  fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  (**(code **)(*in_RDI + 0x48))(in_RDI,local_d8,local_d0);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Parse(const char *&s, bool splitString=false) override {
    const char *start = s;
    T value;
    try {
      value = internal::OptionHelper<T>::Parse(s, splitString);
    } catch (const std::exception& exc) {
      // undocumented: we accept next option after a numeric option
      s = SkipNonSpaces(s);
      throw InvalidOptionValue(name(),
                               std::string(start, s - start),
                               exc.what());
    }
    SetValue(value);
  }